

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TN93.cpp
# Opt level: O1

void dump_histogram(ostream *outStream,char *tag,unsigned_long *hist)

{
  undefined8 in_RAX;
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  unsigned_long k;
  char *pcVar4;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (tag == (char *)0x0) {
    pcVar4 = "\t\"Histogram\" : [";
    lVar3 = 0x10;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(outStream,"\t\"Histogram ",0xc);
    sVar1 = strlen(tag);
    std::__ostream_insert<char,std::char_traits<char>>(outStream,tag,sVar1);
    pcVar4 = "\" : [";
    lVar3 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(outStream,pcVar4,lVar3);
  lVar3 = 0;
  do {
    if (lVar3 != 0) {
      uStack_38._0_5_ = CONCAT14(0x2c,(undefined4)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(outStream,(char *)((long)&uStack_38 + 4),1)
      ;
    }
    uStack_38._0_6_ = CONCAT15(0x5b,(undefined5)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(outStream,(char *)((long)&uStack_38 + 5),1);
    poVar2 = std::ostream::_M_insert<double>(((double)lVar3 + 1.0) / 200.0);
    uStack_38._0_7_ = CONCAT16(0x2c,(undefined6)uStack_38);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)((long)&uStack_38 + 6),1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    uStack_38 = CONCAT17(0x5d,(undefined7)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 200);
  std::__ostream_insert<char,std::char_traits<char>>(outStream,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)outStream + -0x18) + (char)outStream);
  std::ostream::put((char)outStream);
  std::ostream::flush();
  return;
}

Assistant:

void dump_histogram(ostream *outStream, const char *tag, unsigned long *hist) {
  if (tag) {
    (*outStream) << "\t\"Histogram " << tag << "\" : [";
  } else {
    (*outStream) << "\t\"Histogram\" : [";
  }
  for (unsigned long k = 0; k < HISTOGRAM_BINS; k++) {
    if (k) {
      (*outStream) << ',';
    }
    (*outStream) << '[' << (k + 1.) / HISTOGRAM_BINS << ',' << hist[k] << ']';
  }
  (*outStream) << "]" << endl;
}